

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_kernel_info.h
# Opt level: O2

bool __thiscall
KokkosTools::KernelTimer::KernelPerformanceInfo::readFromFile
          (KernelPerformanceInfo *this,FILE *input)

{
  uint32_t i;
  size_t sVar1;
  void *__ptr;
  long lVar2;
  uint32_t i_1;
  ulong __size;
  string_view mangled_name;
  uint32_t kernelNameLength;
  uint32_t recordLen;
  uint32_t kernelT;
  char local_38 [16];
  
  recordLen = 0;
  sVar1 = fread(&recordLen,4,1,(FILE *)input);
  if ((sVar1 & 0xffffffff) == 1) {
    __size = (ulong)recordLen;
    __ptr = malloc(__size);
    fread(__ptr,__size,1,(FILE *)input);
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      input = (FILE *)CONCAT71((int7)((ulong)input >> 8),*(undefined1 *)((long)__ptr + lVar2));
      *(undefined1 *)((long)&kernelNameLength + lVar2) = *(undefined1 *)((long)__ptr + lVar2);
    }
    _kernelT = local_38;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&kernelT,(long)__ptr + 4,(long)__ptr + (ulong)kernelNameLength + 4);
    std::__cxx11::string::operator=((string *)this,(string *)&kernelT);
    std::__cxx11::string::~string((string *)&kernelT);
    mangled_name._M_str = (char *)input;
    mangled_name._M_len = (size_t)(this->kernelName)._M_dataplus._M_p;
    demangleNameKokkos_abi_cxx11_
              ((string *)&kernelT,(KokkosTools *)(this->kernelName)._M_string_length,mangled_name);
    std::__cxx11::string::operator=((string *)this,(string *)&kernelT);
    std::__cxx11::string::~string((string *)&kernelT);
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      *(undefined1 *)((long)&this->callCount + lVar2) =
           *(undefined1 *)((long)__ptr + lVar2 + (ulong)(kernelNameLength + 4));
    }
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      *(undefined1 *)((long)&this->time + lVar2) =
           *(undefined1 *)((long)__ptr + lVar2 + (ulong)(kernelNameLength + 0xc));
    }
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      *(undefined1 *)((long)&this->timeSq + lVar2) =
           *(undefined1 *)((long)__ptr + lVar2 + (ulong)(kernelNameLength + 0x14));
    }
    _kernelT = _kernelT & 0xffffffff00000000;
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      *(undefined1 *)((long)&kernelT + lVar2) =
           *(undefined1 *)((long)__ptr + lVar2 + (ulong)(kernelNameLength + 0x1c));
    }
    if (kernelT < 4) {
      this->kType = kernelT;
    }
    free(__ptr);
  }
  return (int)sVar1 == 1;
}

Assistant:

bool readFromFile(FILE* input) {
    uint32_t recordLen   = 0;
    uint32_t actual_read = fread(&recordLen, sizeof(recordLen), 1, input);
    if (actual_read != 1) return false;

    char* entry = (char*)malloc(recordLen);
    fread(entry, recordLen, 1, input);

    uint32_t nextIndex = 0;
    uint32_t kernelNameLength;
    copy((char*)&kernelNameLength, &entry[nextIndex], sizeof(kernelNameLength));
    nextIndex += sizeof(kernelNameLength);

    this->kernelName = std::string(&entry[nextIndex], kernelNameLength);

    kernelName = demangleNameKokkos(kernelName);

    nextIndex += kernelNameLength;

    copy((char*)&callCount, &entry[nextIndex], sizeof(callCount));
    nextIndex += sizeof(callCount);

    copy((char*)&time, &entry[nextIndex], sizeof(time));
    nextIndex += sizeof(time);

    copy((char*)&timeSq, &entry[nextIndex], sizeof(timeSq));
    nextIndex += sizeof(timeSq);

    uint32_t kernelT = 0;
    copy((char*)&kernelT, &entry[nextIndex], sizeof(kernelT));
    nextIndex += sizeof(kernelT);

    if (kernelT == 0) {
      kType = PARALLEL_FOR;
    } else if (kernelT == 1) {
      kType = PARALLEL_REDUCE;
    } else if (kernelT == 2) {
      kType = PARALLEL_SCAN;
    } else if (kernelT == 3) {
      kType = REGION;
    }

    free(entry);
    return true;
  }